

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

int __thiscall HFSubConsumer::handle_enqueue(HFSubConsumer *this,zframe_t *frame)

{
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  consumer_queue_filter p_Var1;
  zsock_t *self;
  bool bVar2;
  byte *pbVar3;
  size_t sVar4;
  size_t sVar5;
  zframe_t *tmp;
  zframe_t *local_30;
  _zframe_t *local_28;
  
  p_Var1 = this->queuefilter;
  local_30 = frame;
  pbVar3 = zframe_data(frame);
  sVar4 = zframe_size(frame);
  bVar2 = (*p_Var1)(pbVar3,sVar4,this);
  if (bVar2) {
    this_00 = &this->framequeue;
    sVar5 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(this_00);
    if (this->buffersize - 1 <= sVar5) {
      bVar2 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                        ((ConcurrentQueue<_zframe_t*,MyTraits> *)this_00,&this->replacetoken,
                         &local_28);
      if (bVar2) {
        zframe_destroy(&local_28);
      }
    }
    moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::
    enqueue<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0,_zframe_t*const&>
              ((ExplicitProducer *)&(this->ptoken).producer[-1].token,&local_30);
    if (this->waiting == true) {
      self = this->rep;
      sVar5 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(this_00);
      zsock_bsend(self,"8",sVar5,0);
      this->waiting = false;
    }
  }
  else {
    zframe_destroy(&local_30);
  }
  return 0;
}

Assistant:

int HFSubConsumer::handle_enqueue(zframe_t *frame){
    //Only add to queue if it passes queuefilter
    if(!queuefilter(zframe_data(frame), zframe_size(frame), this)){
        zframe_destroy(&frame);
        return 0;
    }
    //Pseudo ring buffer, pops oldest so that ConcurrentQueue doesn't allocate new block and acts like concurrent ringbuffer
    if(framequeue.size_approx() >= buffersize-1){
        //Do this first before replacing with new frame
        zframe_t* tmp;
        if(framequeue.try_dequeue(replacetoken, tmp)){
            zframe_destroy(&tmp);
        }
    }
    framequeue.enqueue(ptoken, frame);

    if(waiting){
        zsock_bsend(rep, "8", static_cast<uint64_t>(framequeue.size_approx()), NULL);
        waiting = false;
    }
    return 0;
}